

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Vector3 Vector3Barycenter(Vector3 p,Vector3 a,Vector3 b,Vector3 c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector3 VVar7;
  Vector3 v2_00;
  Vector3 v1_00;
  float denom;
  float d21;
  float d20;
  float d11;
  float d01;
  float d00;
  Vector3 v2;
  Vector3 v1;
  Vector3 v0;
  Vector3 c_local;
  Vector3 b_local;
  Vector3 a_local;
  Vector3 p_local;
  undefined4 uStack_14;
  Vector3 result;
  
  VVar7 = Vector3Subtract(b,a);
  v2_00 = Vector3Subtract(c,a);
  v1_00 = Vector3Subtract(p,a);
  fVar1 = Vector3DotProduct(VVar7,VVar7);
  fVar2 = Vector3DotProduct(VVar7,v2_00);
  fVar3 = Vector3DotProduct(v2_00,v2_00);
  fVar4 = Vector3DotProduct(v1_00,VVar7);
  fVar5 = Vector3DotProduct(v1_00,v2_00);
  fVar6 = fVar1 * fVar3 - fVar2 * fVar2;
  fVar3 = (fVar3 * fVar4 - fVar2 * fVar5) / fVar6;
  fVar6 = (fVar1 * fVar5 - fVar2 * fVar4) / fVar6;
  VVar7.z = fVar6;
  VVar7.x = 1.0 - (fVar6 + fVar3);
  VVar7.y = fVar3;
  return VVar7;
}

Assistant:

RMDEF Vector3 Vector3Barycenter(Vector3 p, Vector3 a, Vector3 b, Vector3 c)
{
    //Vector v0 = b - a, v1 = c - a, v2 = p - a;

    Vector3 v0 = Vector3Subtract(b, a);
    Vector3 v1 = Vector3Subtract(c, a);
    Vector3 v2 = Vector3Subtract(p, a);
    float d00 = Vector3DotProduct(v0, v0);
    float d01 = Vector3DotProduct(v0, v1);
    float d11 = Vector3DotProduct(v1, v1);
    float d20 = Vector3DotProduct(v2, v0);
    float d21 = Vector3DotProduct(v2, v1);

    float denom = d00*d11 - d01*d01;

    Vector3 result = { 0 };

    result.y = (d11*d20 - d01*d21)/denom;
    result.z = (d00*d21 - d01*d20)/denom;
    result.x = 1.0f - (result.z + result.y);

    return result;
}